

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>const>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,__1,_1,_0,__1,_1> *dst,
               CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
               *src,assign_op<float,_float> *func)

{
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Kernel kernel;
  plainobjectbase_evaluator_data<float,_0> local_50;
  SrcEvaluatorType local_48;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_38;
  
  local_48.
  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_float>
  .m_d.argImpl.super_evaluator<Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>.
  super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_float>
  .super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>.
  m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>.m_d.
  data = (evaluator<Eigen::ArrayWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>)
         (((src->m_xpr).m_expression)->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
         ).m_storage.m_data;
  resize_if_allowed<Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,Eigen::ArrayWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>const>,float,float>
            (dst,src,func);
  local_50.data =
       (dst->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  local_38.m_dst = (DstEvaluatorType *)&local_50;
  local_38.m_src = &local_48;
  local_38.m_functor = func;
  local_38.m_dstExpr = dst;
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_3,_0>
  ::run(&local_38);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}